

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::AddFixed64
          (UnknownFieldLiteParserHelper *this,uint32 num,uint64 value)

{
  char buffer [8];
  
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer._0_4_ = num;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)(num * 8 + 1),this->unknown_);
    buffer = (char  [8])value;
    std::__cxx11::string::append((char *)this->unknown_,(ulong)buffer);
  }
  return;
}

Assistant:

void AddFixed64(uint32 num, uint64 value) {
    if (unknown_ == nullptr) return;
    WriteVarint(num * 8 + 1, unknown_);
    char buffer[8];
    io::CodedOutputStream::WriteLittleEndian64ToArray(
        value, reinterpret_cast<uint8*>(buffer));
    unknown_->append(buffer, 8);
  }